

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLRefInfo::serialize(XMLRefInfo *this,XSerializeEngine *serEng)

{
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fDeclared);
    XSerializeEngine::operator>>(serEng,&this->fUsed);
    XSerializeEngine::readString(serEng,&this->fRefName);
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fDeclared);
  XSerializeEngine::operator<<(serEng,this->fUsed);
  XSerializeEngine::writeString(serEng,this->fRefName,0,false);
  return;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}